

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall
inject::context<0>::component_descriptor::component_descriptor(component_descriptor *this)

{
  component_descriptor *this_local;
  
  this->id = -1;
  this->allocator = (generic_activator *)0x0;
  this->constructor = (generic_activator *)0x0;
  std::__cxx11::
  list<inject::context<0>::generic_activator_*,_std::allocator<inject::context<0>::generic_activator_*>_>
  ::list(&this->activators);
  std::__cxx11::string::string((string *)&this->component_name);
  binding::binding(&this->default_binding);
  std::
  map<long,_inject::context<0>::generic_component_cast_*,_std::less<long>,_std::allocator<std::pair<const_long,_inject::context<0>::generic_component_cast_*>_>_>
  ::map(&this->component_cast);
  this->activating = false;
  return;
}

Assistant:

component_descriptor() :
        id(INVALID_ID),
        allocator(0),
        constructor(0),
        activating(false) { }